

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HArray.hpp
# Opt level: O2

void __thiscall
Qentem::HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::operator+=
          (HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *this,
          HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *src)

{
  uint uVar1;
  SizeT *index_00;
  HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *pHVar2;
  String<char16_t> *pSVar3;
  SizeT new_size;
  String<char16_t> *src_00;
  SizeT *index;
  SizeT *local_48;
  String<char16_t> local_40;
  
  uVar1 = (src->
          super_HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
          ).index_;
  src_00 = (String<char16_t> *)
           ((src->
            super_HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
            ).hashTable_ +
           (src->
           super_HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
           ).capacity_);
  new_size = (this->
             super_HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
             ).index_ + uVar1;
  if ((this->
      super_HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
      ).capacity_ < new_size) {
    HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
    ::resize(&this->
              super_HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
             ,new_size);
  }
  pSVar3 = src_00 + (ulong)uVar1 * 3;
  for (; src_00 < pSVar3; src_00 = src_00 + 3) {
    if (*(SizeT *)&src_00[1].storage_ != 0) {
      pHVar2 = HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
               ::find(&this->
                       super_HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
                      ,&local_48,src_00->storage_,src_00->length_,*(SizeT *)&src_00[1].storage_);
      index_00 = local_48;
      if (pHVar2 == (HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)0x0) {
        String<char16_t>::String(&local_40,src_00);
        pHVar2 = HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
                 ::insert(&this->
                           super_HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
                          ,index_00,&local_40,*(SizeT *)&src_00[1].storage_);
        Memory::Deallocate(local_40.storage_);
        (pHVar2->Value).type_ = Undefined;
        (pHVar2->Value).field_0.array_.storage_ = (Value<char16_t> *)0x0;
        *(SizeT *)((long)&(pHVar2->Value).field_0 + 8) = 0;
        *(SizeT *)((long)&(pHVar2->Value).field_0 + 0xc) = 0;
      }
      Value<char16_t>::operator=(&pHVar2->Value,(Value<char16_t> *)&src_00[1].length_);
    }
  }
  return;
}

Assistant:

void operator+=(const HArray &src) {
        const SizeT  n_size   = (Size() + src.Size());
        const HItem *src_item = src.First();
        const HItem *src_end  = src_item + src.Size();

        if (n_size > Capacity()) {
            resize(n_size);
        }

        while (src_item < src_end) {
            if (src_item->Hash != 0) {
                SizeT *index;
                HItem *storage_item = find(index, src_item->Key.First(), src_item->Key.Length(), src_item->Hash);

                if (storage_item == nullptr) {
                    storage_item = insert(index, Key_T{src_item->Key}, src_item->Hash);
                    Memory::Initialize(&(storage_item->Value));
                }

                storage_item->Value = src_item->Value;
            }

            ++src_item;
        }
    }